

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O0

uint16_t eia608_row_column_pramble(int row,int col,int chan,int underline)

{
  uint16_t uVar1;
  int in_ECX;
  int in_EDX;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  uVar1 = eia608_row_pramble(in_EDX,in_ECX,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  return uVar1;
}

Assistant:

uint16_t eia608_row_column_pramble(int row, int col, int chan, int underline) { return eia608_row_pramble(row, chan, 0x10 | (col / 4), underline); }